

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

KeywordNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::KeywordNameSyntax,slang::syntax::KeywordNameSyntax_const&>
          (BumpAllocator *this,KeywordNameSyntax *args)

{
  SyntaxNode *pSVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SyntaxKind SVar6;
  undefined4 uVar7;
  KeywordNameSyntax *pKVar8;
  
  pKVar8 = (KeywordNameSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((KeywordNameSyntax *)this->endPtr < pKVar8 + 1) {
    pKVar8 = (KeywordNameSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pKVar8 + 1);
  }
  (pKVar8->keyword).info = (args->keyword).info;
  SVar6 = (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  uVar7 = *(undefined4 *)&(args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  TVar2 = (args->keyword).kind;
  uVar3 = (args->keyword).field_0x2;
  NVar4.raw = (args->keyword).numFlags.raw;
  uVar5 = (args->keyword).rawLen;
  (pKVar8->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode;
  (pKVar8->keyword).kind = TVar2;
  (pKVar8->keyword).field_0x2 = uVar3;
  (pKVar8->keyword).numFlags = (NumericTokenFlags)NVar4.raw;
  (pKVar8->keyword).rawLen = uVar5;
  (pKVar8->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = SVar6;
  *(undefined4 *)&(pKVar8->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
       uVar7;
  (pKVar8->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  return pKVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }